

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O1

void __thiscall CConnman::ThreadDNSAddressSeed(CConnman *this)

{
  size_type *psVar1;
  long lVar2;
  DNSLookupFn dns_lookup_function;
  pointer pCVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  time_point tVar8;
  time_point tVar9;
  char *pcVar10;
  size_t sVar11;
  duration dVar12;
  char *pcVar13;
  uint uVar14;
  char *pcVar15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  ulong uVar16;
  pointer cip;
  pointer args;
  long in_FS_OFFSET;
  byte bVar17;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view logging_function_02;
  string_view logging_function_03;
  string_view logging_function_04;
  string_view logging_function_05;
  string_view logging_function_06;
  string_view logging_function_07;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view source_file_02;
  string_view source_file_03;
  string_view source_file_04;
  string_view source_file_05;
  string_view source_file_06;
  string_view source_file_07;
  undefined1 in_stack_fffffffffffffdf8 [15];
  CThreadInterrupt *this_00;
  undefined4 in_stack_fffffffffffffe10;
  uint in_stack_fffffffffffffe14;
  _Any_data local_1d8;
  code *local_1c8;
  vector<CNetAddr,_std::allocator<CNetAddr>_> addresses;
  ServiceFlags requiredServiceBits;
  vector<CAddress,_std::allocator<CAddress>_> vAdd;
  int found;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  seeds;
  direct_or_indirect local_160;
  uint local_150;
  Network local_148;
  uint32_t uStack_144;
  uint16_t local_140;
  CAddress addr;
  CNetAddr resolveSource;
  string host;
  FastRandomContext rng;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  rng.super_RandomMixin<FastRandomContext>.bitbuf = (uint64_t)&rng.rng;
  std::__cxx11::string::_M_construct<char_const*>((string *)&rng,"-seednode","");
  bVar4 = ArgsManager::IsArgSet(&gArgs,(string *)&rng);
  if ((ChaCha20 *)rng.super_RandomMixin<FastRandomContext>.bitbuf != &rng.rng) {
    operator_delete((void *)rng.super_RandomMixin<FastRandomContext>.bitbuf,
                    rng.rng.m_aligned.input._0_8_ + 1);
  }
  iVar6 = 0;
  if (bVar4) {
    tVar8 = NodeClock::now();
    rng.super_RandomMixin<FastRandomContext>.bitbuf = 0x1e;
    logging_function._M_str = "ThreadDNSAddressSeed";
    logging_function._M_len = 0x14;
    source_file._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp";
    source_file._M_len = 0x57;
    LogPrintFormatInternal<long>
              (logging_function,source_file,0x88f,ALL,Info,(ConstevalFormatString<1U>)0x7e62ea,
               (long *)&rng);
    iVar6 = 0;
    do {
      bVar4 = CThreadInterrupt::operator_cast_to_bool(&this->interruptNet);
      if ((bVar4) ||
         (bVar5 = CThreadInterrupt::sleep_for(&this->interruptNet,(duration)0x1dcd6500), !bVar5))
      goto LAB_001a6874;
      tVar9 = NodeClock::now();
      if ((long)tVar8.__d.__r + 30000000000 < (long)tVar9.__d.__r) {
        pcVar10 = 
        "Couldn\'t connect to enough peers via seed nodes. Handing fetch logic to the DNS seeds.\n";
        iVar7 = 0x897;
        goto LAB_001a685e;
      }
      iVar6 = GetFullOutboundConnCount(this);
    } while (iVar6 < 2);
    pcVar10 = "P2P peers available. Finished fetching data from seed nodes.\n";
    iVar7 = 0x89d;
LAB_001a685e:
    logging_function_00._M_str = "ThreadDNSAddressSeed";
    logging_function_00._M_len = 0x14;
    source_file_00._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp";
    source_file_00._M_len = 0x57;
    LogPrintFormatInternal<>
              (logging_function_00,source_file_00,iVar7,ALL,Info,(ConstevalFormatString<0U>)pcVar10)
    ;
    bVar4 = true;
LAB_001a6874:
    if (bVar4 == false) goto LAB_001a6f5c;
  }
  FastRandomContext::FastRandomContext(&rng,false);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&seeds,&this->m_params->vSeeds);
  std::
  shuffle<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,FastRandomContext&>
            ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )seeds.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )seeds.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,&rng);
  psVar1 = &addr.super_CService.super_CNetAddr.m_addr._size;
  addr.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&addr,"-forcednsseed","");
  bVar4 = ArgsManager::GetBoolArg(&gArgs,(string *)&addr,false);
  if ((size_type *)addr.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect !=
      psVar1) {
    operator_delete(addr.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect,
                    CONCAT44(addr.super_CService.super_CNetAddr.m_addr._20_4_,
                             addr.super_CService.super_CNetAddr.m_addr._size) + 1);
  }
  if (bVar4) {
LAB_001a693c:
    uVar16 = (ulong)((long)seeds.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)seeds.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 5;
  }
  else {
    uVar16 = 0;
    sVar11 = AddrMan::Size(this->addrman,(optional<Network>)0x0,(optional<bool>)0x0);
    if (sVar11 == 0) goto LAB_001a693c;
  }
  if ((iVar6 < 2) || ((int)uVar16 != 0)) {
    found = 0;
    sVar11 = AddrMan::Size(this->addrman,(optional<Network>)0x0,(optional<bool>)0x0);
    pcVar10 = (char *)0x12c;
    if (sVar11 < 1000) {
      pcVar10 = (char *)0xb;
    }
    bVar17 = seeds.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start ==
             seeds.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (!(bool)bVar17) {
      this_00 = &this->interruptNet;
      args = seeds.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
      do {
        uVar14 = (uint)uVar16;
        if (uVar14 == 0) {
          sVar11 = AddrMan::Size(this->addrman,(optional<Network>)0x0,(optional<bool>)0x0);
          uVar14 = 3;
          if (sVar11 == 0) goto LAB_001a6a06;
          logging_function_04._M_str = "ThreadDNSAddressSeed";
          logging_function_04._M_len = 0x14;
          source_file_04._M_str =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
          ;
          source_file_04._M_len = 0x57;
          addr.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect = pcVar10;
          LogPrintFormatInternal<long>
                    (logging_function_04,source_file_04,0x8c8,ALL,Info,
                     (ConstevalFormatString<1U>)0x7e63e0,(long *)&addr);
          pcVar15 = pcVar10;
          do {
            if ((long)pcVar15 < 1) {
              uVar14 = 3;
              goto LAB_001a6a06;
            }
            pcVar13 = (char *)0xb;
            if ((long)pcVar15 < 0xb) {
              pcVar13 = pcVar15;
            }
            bVar4 = CThreadInterrupt::sleep_for(this_00,(duration)((long)pcVar13 * 1000000000));
            iVar6 = 1;
            uVar16 = 3;
            if (!bVar4) goto LAB_001a6e95;
            iVar7 = GetFullOutboundConnCount(this);
            pcVar15 = pcVar15 + -(long)pcVar13;
          } while (iVar7 < 2);
          if (found < 1) {
            iVar7 = 0x8d7;
            pcVar15 = "P2P peers available. Skipped DNS seeding.\n";
          }
          else {
            iVar7 = 0x8d5;
            logging_function_05._M_str = "ThreadDNSAddressSeed";
            logging_function_05._M_len = 0x14;
            source_file_05._M_str =
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
            ;
            source_file_05._M_len = 0x57;
            LogPrintFormatInternal<int>
                      (logging_function_05,source_file_05,0x8d4,ALL,Info,
                       (ConstevalFormatString<1U>)0x7e640f,&found);
            pcVar15 = "P2P peers available. Finished DNS seeding.\n";
          }
          logging_function_06._M_str = "ThreadDNSAddressSeed";
          logging_function_06._M_len = 0x14;
          source_file_06._M_str =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
          ;
          source_file_06._M_len = 0x57;
          LogPrintFormatInternal<>
                    (logging_function_06,source_file_06,iVar7,ALL,Info,
                     (ConstevalFormatString<0U>)pcVar15);
        }
        else {
LAB_001a6a06:
          bVar4 = CThreadInterrupt::operator_cast_to_bool(this_00);
          iVar6 = 1;
          if (!bVar4) {
            if (((this->fNetworkActive)._M_base._M_i & 1U) == 0) {
              logging_function_02._M_str = "ThreadDNSAddressSeed";
              logging_function_02._M_len = 0x14;
              source_file_02._M_str =
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
              ;
              source_file_02._M_len = 0x57;
              LogPrintFormatInternal<>
                        (logging_function_02,source_file_02,0x8e3,ALL,Info,
                         (ConstevalFormatString<0U>)0x7e6489);
              do {
                bVar4 = CThreadInterrupt::sleep_for(this_00,(duration)0x3b9aca00);
                if (!bVar4) goto LAB_001a6e92;
              } while (((this->fNetworkActive)._M_base._M_i & 1U) == 0);
            }
            args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x8e9;
            logging_function_03._M_str = "ThreadDNSAddressSeed";
            logging_function_03._M_len = 0x14;
            source_file_03._M_str =
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
            ;
            source_file_03._M_len = 0x57;
            LogPrintFormatInternal<std::__cxx11::string>
                      (logging_function_03,source_file_03,0x8e9,ALL,Info,
                       (ConstevalFormatString<1U>)0x7e64cb,args);
            bVar4 = HaveNameProxy();
            if (bVar4) {
              AddAddrFetch(this,args);
            }
            else {
              vAdd.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              vAdd.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              vAdd.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              requiredServiceBits = NODE_WITNESS|NODE_NETWORK;
              tinyformat::format<ServiceFlags,std::__cxx11::string>
                        (&host,(tinyformat *)"x%x.%s",(char *)&requiredServiceBits,
                         (ServiceFlags *)args,args_1);
              CNetAddr::CNetAddr(&resolveSource);
              bVar4 = CNetAddr::SetInternal(&resolveSource,&host);
              iVar6 = 5;
              if (bVar4) {
                std::
                function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
                ::function((function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
                            *)&local_1d8,&g_dns_lookup_abi_cxx11_);
                dns_lookup_function.super__Function_base._M_functor._M_pod_data[0xf] = bVar17;
                dns_lookup_function.super__Function_base._M_functor._0_15_ =
                     in_stack_fffffffffffffdf8;
                dns_lookup_function.super__Function_base._M_manager = (_Manager_type)this_00;
                dns_lookup_function._M_invoker._0_4_ = in_stack_fffffffffffffe10;
                dns_lookup_function._M_invoker._4_4_ = in_stack_fffffffffffffe14;
                LookupHost(&addresses,&host,0x20,true,dns_lookup_function);
                if (local_1c8 != (code *)0x0) {
                  (*local_1c8)(&local_1d8,&local_1d8,__destroy_functor);
                }
                pCVar3 = addresses.super__Vector_base<CNetAddr,_std::allocator<CNetAddr>_>._M_impl.
                         super__Vector_impl_data._M_finish;
                cip = addresses.super__Vector_base<CNetAddr,_std::allocator<CNetAddr>_>._M_impl.
                      super__Vector_impl_data._M_start;
                if (addresses.super__Vector_base<CNetAddr,_std::allocator<CNetAddr>_>._M_impl.
                    super__Vector_impl_data._M_start ==
                    addresses.super__Vector_base<CNetAddr,_std::allocator<CNetAddr>_>._M_impl.
                    super__Vector_impl_data._M_finish) {
                  AddAddrFetch(this,args);
                }
                else {
                  do {
                    CService::CService((CService *)&local_160.indirect_contents,cip,
                                       this->m_params->nDefaultPort);
                    prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
                              ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr,
                               (prevector<16U,_unsigned_char,_unsigned_int,_int> *)
                               &local_160.indirect_contents);
                    addr.super_CService.super_CNetAddr.m_net = local_148;
                    addr.super_CService.super_CNetAddr.m_scope_id = uStack_144;
                    addr.super_CService.port = local_140;
                    addr.nTime.__d.__r = (duration)100000000;
                    addr.nServices = NODE_WITNESS|NODE_NETWORK;
                    if (0x10 < local_150) {
                      free(local_160.indirect_contents.indirect);
                      local_160.indirect_contents.indirect = (char *)0x0;
                    }
                    tVar8 = NodeClock::now();
                    dVar12 = RandomMixin<FastRandomContext>::
                             rand_uniform_duration<std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                                       (&rng.super_RandomMixin<FastRandomContext>,
                                        (duration)0xfffffffffffaba00);
                    addr.nTime.__d.__r =
                         (duration)(dVar12.__r + (long)tVar8.__d.__r / 1000000000 + -0x3f480);
                    std::vector<CAddress,_std::allocator<CAddress>_>::push_back(&vAdd,&addr);
                    found = found + 1;
                    if (0x10 < addr.super_CService.super_CNetAddr.m_addr._size) {
                      free(addr.super_CService.super_CNetAddr.m_addr._union.indirect_contents.
                           indirect);
                      addr.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
                           (char *)0x0;
                    }
                    cip = cip + 1;
                  } while (cip != pCVar3);
                  AddrMan::Add(this->addrman,&vAdd,&resolveSource,(seconds)0x0);
                }
                std::vector<CNetAddr,_std::allocator<CNetAddr>_>::~vector(&addresses);
                iVar6 = 0;
                in_stack_fffffffffffffe14 = uVar14;
              }
              if (0x10 < resolveSource.m_addr._size) {
                free(resolveSource.m_addr._union.indirect_contents.indirect);
                resolveSource.m_addr._union.indirect_contents.indirect = (char *)0x0;
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)host._M_dataplus._M_p != &host.field_2) {
                operator_delete(host._M_dataplus._M_p,host.field_2._M_allocated_capacity + 1);
              }
              std::vector<CAddress,_std::allocator<CAddress>_>::~vector(&vAdd);
              if (!bVar4) goto LAB_001a6e92;
            }
            uVar14 = uVar14 - 1;
            iVar6 = 0;
          }
LAB_001a6e92:
          uVar16 = (ulong)uVar14;
        }
LAB_001a6e95:
        if ((iVar6 != 5) && (iVar6 != 0)) {
          if ((bVar17 & 1) == 0) goto LAB_001a6f42;
          break;
        }
        args = args + 1;
        bVar17 = args == seeds.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
      } while (!(bool)bVar17);
    }
    logging_function_07._M_str = "ThreadDNSAddressSeed";
    logging_function_07._M_len = 0x14;
    source_file_07._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp";
    source_file_07._M_len = 0x57;
    LogPrintFormatInternal<int>
              (logging_function_07,source_file_07,0x90d,ALL,Info,(ConstevalFormatString<1U>)0x7e640f
               ,&found);
  }
  else {
    logging_function_01._M_str = "ThreadDNSAddressSeed";
    logging_function_01._M_len = 0x14;
    source_file_01._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp";
    source_file_01._M_len = 0x57;
    LogPrintFormatInternal<>
              (logging_function_01,source_file_01,0x90f,ALL,Info,(ConstevalFormatString<0U>)0x7e64f6
              );
  }
LAB_001a6f42:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&seeds);
  ChaCha20::~ChaCha20(&rng.rng);
LAB_001a6f5c:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CConnman::ThreadDNSAddressSeed()
{
    int outbound_connection_count = 0;

    if (gArgs.IsArgSet("-seednode")) {
        auto start = NodeClock::now();
        constexpr std::chrono::seconds SEEDNODE_TIMEOUT = 30s;
        LogPrintf("-seednode enabled. Trying the provided seeds for %d seconds before defaulting to the dnsseeds.\n", SEEDNODE_TIMEOUT.count());
        while (!interruptNet) {
            if (!interruptNet.sleep_for(std::chrono::milliseconds(500)))
                return;

            // Abort if we have spent enough time without reaching our target.
            // Giving seed nodes 30 seconds so this does not become a race against fixedseeds (which triggers after 1 min)
            if (NodeClock::now() > start + SEEDNODE_TIMEOUT) {
                LogPrintf("Couldn't connect to enough peers via seed nodes. Handing fetch logic to the DNS seeds.\n");
                break;
            }

            outbound_connection_count = GetFullOutboundConnCount();
            if (outbound_connection_count >= SEED_OUTBOUND_CONNECTION_THRESHOLD) {
                LogPrintf("P2P peers available. Finished fetching data from seed nodes.\n");
                break;
            }
        }
    }

    FastRandomContext rng;
    std::vector<std::string> seeds = m_params.DNSSeeds();
    std::shuffle(seeds.begin(), seeds.end(), rng);
    int seeds_right_now = 0; // Number of seeds left before testing if we have enough connections

    if (gArgs.GetBoolArg("-forcednsseed", DEFAULT_FORCEDNSSEED)) {
        // When -forcednsseed is provided, query all.
        seeds_right_now = seeds.size();
    } else if (addrman.Size() == 0) {
        // If we have no known peers, query all.
        // This will occur on the first run, or if peers.dat has been
        // deleted.
        seeds_right_now = seeds.size();
    }

    // Proceed with dnsseeds if seednodes hasn't reached the target or if forcednsseed is set
    if (outbound_connection_count < SEED_OUTBOUND_CONNECTION_THRESHOLD || seeds_right_now) {
        // goal: only query DNS seed if address need is acute
        // * If we have a reasonable number of peers in addrman, spend
        //   some time trying them first. This improves user privacy by
        //   creating fewer identifying DNS requests, reduces trust by
        //   giving seeds less influence on the network topology, and
        //   reduces traffic to the seeds.
        // * When querying DNS seeds query a few at once, this ensures
        //   that we don't give DNS seeds the ability to eclipse nodes
        //   that query them.
        // * If we continue having problems, eventually query all the
        //   DNS seeds, and if that fails too, also try the fixed seeds.
        //   (done in ThreadOpenConnections)
        int found = 0;
        const std::chrono::seconds seeds_wait_time = (addrman.Size() >= DNSSEEDS_DELAY_PEER_THRESHOLD ? DNSSEEDS_DELAY_MANY_PEERS : DNSSEEDS_DELAY_FEW_PEERS);

        for (const std::string& seed : seeds) {
            if (seeds_right_now == 0) {
                seeds_right_now += DNSSEEDS_TO_QUERY_AT_ONCE;

                if (addrman.Size() > 0) {
                    LogPrintf("Waiting %d seconds before querying DNS seeds.\n", seeds_wait_time.count());
                    std::chrono::seconds to_wait = seeds_wait_time;
                    while (to_wait.count() > 0) {
                        // if sleeping for the MANY_PEERS interval, wake up
                        // early to see if we have enough peers and can stop
                        // this thread entirely freeing up its resources
                        std::chrono::seconds w = std::min(DNSSEEDS_DELAY_FEW_PEERS, to_wait);
                        if (!interruptNet.sleep_for(w)) return;
                        to_wait -= w;

                        if (GetFullOutboundConnCount() >= SEED_OUTBOUND_CONNECTION_THRESHOLD) {
                            if (found > 0) {
                                LogPrintf("%d addresses found from DNS seeds\n", found);
                                LogPrintf("P2P peers available. Finished DNS seeding.\n");
                            } else {
                                LogPrintf("P2P peers available. Skipped DNS seeding.\n");
                            }
                            return;
                        }
                    }
                }
            }

            if (interruptNet) return;

            // hold off on querying seeds if P2P network deactivated
            if (!fNetworkActive) {
                LogPrintf("Waiting for network to be reactivated before querying DNS seeds.\n");
                do {
                    if (!interruptNet.sleep_for(std::chrono::seconds{1})) return;
                } while (!fNetworkActive);
            }

            LogPrintf("Loading addresses from DNS seed %s\n", seed);
            // If -proxy is in use, we make an ADDR_FETCH connection to the DNS resolved peer address
            // for the base dns seed domain in chainparams
            if (HaveNameProxy()) {
                AddAddrFetch(seed);
            } else {
                std::vector<CAddress> vAdd;
                constexpr ServiceFlags requiredServiceBits{SeedsServiceFlags()};
                std::string host = strprintf("x%x.%s", requiredServiceBits, seed);
                CNetAddr resolveSource;
                if (!resolveSource.SetInternal(host)) {
                    continue;
                }
                // Limit number of IPs learned from a single DNS seed. This limit exists to prevent the results from
                // one DNS seed from dominating AddrMan. Note that the number of results from a UDP DNS query is
                // bounded to 33 already, but it is possible for it to use TCP where a larger number of results can be
                // returned.
                unsigned int nMaxIPs = 32;
                const auto addresses{LookupHost(host, nMaxIPs, true)};
                if (!addresses.empty()) {
                    for (const CNetAddr& ip : addresses) {
                        CAddress addr = CAddress(CService(ip, m_params.GetDefaultPort()), requiredServiceBits);
                        addr.nTime = rng.rand_uniform_delay(Now<NodeSeconds>() - 3 * 24h, -4 * 24h); // use a random age between 3 and 7 days old
                        vAdd.push_back(addr);
                        found++;
                    }
                    addrman.Add(vAdd, resolveSource);
                } else {
                    // If the seed does not support a subdomain with our desired service bits,
                    // we make an ADDR_FETCH connection to the DNS resolved peer address for the
                    // base dns seed domain in chainparams
                    AddAddrFetch(seed);
                }
            }
            --seeds_right_now;
        }
        LogPrintf("%d addresses found from DNS seeds\n", found);
    } else {
        LogPrintf("Skipping DNS seeds. Enough peers have been found\n");
    }
}